

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TransformFeedback::APIErrors::iterate(APIErrors *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ContextType CVar9;
  ApiType AVar10;
  GLenum GVar11;
  GLuint GVar12;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  ContextInfo *pCVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestContext *pTVar15;
  TestLog *pTVar16;
  bool local_124;
  bool local_122;
  bool local_120;
  bool local_11e;
  bool local_11d;
  bool local_41;
  bool test_error;
  bool is_ok;
  bool is_arb_tf_instanced;
  bool is_arb_tf_3;
  bool is_arb_tf_2;
  bool is_ext_tf_1;
  bool is_at_least_gl_42;
  bool is_at_least_gl_40;
  bool is_at_least_gl_30;
  Functions *gl;
  APIErrors *this_local;
  Functions *gl_00;
  
  pRVar13 = deqp::Context::getRenderContext(this->m_context);
  iVar8 = (*pRVar13->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  pRVar13 = deqp::Context::getRenderContext(this->m_context);
  CVar9.super_ApiType.m_bits = (ApiType)(*pRVar13->_vptr_RenderContext[2])();
  AVar10 = glu::ApiType::core(3,0);
  bVar1 = glu::contextSupports(CVar9,AVar10);
  pRVar13 = deqp::Context::getRenderContext(this->m_context);
  CVar9.super_ApiType.m_bits = (ApiType)(*pRVar13->_vptr_RenderContext[2])();
  AVar10 = glu::ApiType::core(4,0);
  bVar2 = glu::contextSupports(CVar9,AVar10);
  pRVar13 = deqp::Context::getRenderContext(this->m_context);
  CVar9.super_ApiType.m_bits = (ApiType)(*pRVar13->_vptr_RenderContext[2])();
  AVar10 = glu::ApiType::core(4,2);
  bVar3 = glu::contextSupports(CVar9,AVar10);
  pCVar14 = deqp::Context::getContextInfo(this->m_context);
  bVar4 = glu::ContextInfo::isExtensionSupported(pCVar14,"GL_EXT_transform_feedback");
  pCVar14 = deqp::Context::getContextInfo(this->m_context);
  bVar5 = glu::ContextInfo::isExtensionSupported(pCVar14,"GL_ARB_transform_feedback2");
  pCVar14 = deqp::Context::getContextInfo(this->m_context);
  bVar6 = glu::ContextInfo::isExtensionSupported(pCVar14,"GL_ARB_transform_feedback3");
  pCVar14 = deqp::Context::getContextInfo(this->m_context);
  bVar7 = glu::ContextInfo::isExtensionSupported(pCVar14,"GL_ARB_transform_feedback_instanced");
  if (bVar4) {
    pRVar13 = deqp::Context::getRenderContext(this->m_context);
    iVar8 = (*pRVar13->_vptr_RenderContext[7])(pRVar13,"glBindBufferOffsetEXT");
    this->m_glBindBufferOffsetEXT = (BindBufferOffsetEXT_ProcAddress)CONCAT44(extraout_var_00,iVar8)
    ;
    pRVar13 = deqp::Context::getRenderContext(this->m_context);
    iVar8 = (*pRVar13->_vptr_RenderContext[7])(pRVar13,"glGetIntegerIndexedvEXT");
    this->m_glGetIntegerIndexedvEXT =
         (GetIntegerIndexedvEXT_ProcAddress)CONCAT44(extraout_var_01,iVar8);
    pRVar13 = deqp::Context::getRenderContext(this->m_context);
    iVar8 = (*pRVar13->_vptr_RenderContext[7])(pRVar13,"glGetBooleanIndexedvEXT");
    this->m_glGetBooleanIndexedvEXT =
         (GetBooleanIndexedvEXT_ProcAddress)CONCAT44(extraout_var_02,iVar8);
  }
  if ((bVar2) || (bVar5)) {
    (*gl_00->genTransformFeedbacks)(1,&this->m_transform_feedback_object_0);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xa2);
  }
  if ((bVar2) || (bVar6)) {
    (*gl_00->genQueries)(1,&this->m_query_object);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"glGenQueries call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xaa);
  }
  if ((bVar3) || (bVar7)) {
    (*gl_00->genTransformFeedbacks)(1,&this->m_transform_feedback_object_1);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"glGenTransformFeedbacks call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0xb2);
  }
  (*gl_00->genVertexArrays)(1,&this->m_vertex_array_object);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xbe);
  (*gl_00->bindVertexArray)(this->m_vertex_array_object);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc1);
  (*gl_00->genBuffers)(1,&this->m_buffer_0);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xc5);
  (*gl_00->bindBuffer)(0x8c8e,this->m_buffer_0);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,200);
  (*gl_00->bufferData)(0x8c8e,0x10,(void *)0x0,0x88e4);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xcb);
  (*gl_00->genBuffers)(1,&this->m_buffer_1);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xce);
  (*gl_00->bindBuffer)(0x8892,this->m_buffer_1);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xd1);
  (*gl_00->bufferData)(0x8892,8,m_buffer_1_data,0x88e4);
  GVar11 = (*gl_00->getError)();
  glu::checkError(GVar11,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xd4);
  pTVar15 = deqp::Context::getTestContext(this->m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar15);
  GVar12 = Utilities::buildProgram
                     (gl_00,pTVar16,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                      s_vertex_shader_with_input_output,s_fragment_shader,&m_varying_name,1,0x8c8c,
                      false,(GLint *)0x0);
  this->m_program_id_with_input_output = GVar12;
  pTVar15 = deqp::Context::getTestContext(this->m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar15);
  GVar12 = Utilities::buildProgram
                     (gl_00,pTVar16,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                      s_vertex_shader_with_output,s_fragment_shader,&m_varying_name,1,0x8c8c,true,
                      (GLint *)0x0);
  this->m_program_id_with_output = GVar12;
  pTVar15 = deqp::Context::getTestContext(this->m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar15);
  GVar12 = Utilities::buildProgram
                     (gl_00,pTVar16,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                      s_vertex_shader_without_output,s_fragment_shader,(GLchar **)0x0,0,0x8c8d,false
                      ,(GLint *)0x0);
  this->m_program_id_without_output = GVar12;
  pTVar15 = deqp::Context::getTestContext(this->m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar15);
  GVar12 = Utilities::buildProgram
                     (gl_00,pTVar16,m_geometry_shader,(GLchar *)0x0,(GLchar *)0x0,
                      s_vertex_shader_without_output,s_fragment_shader,&m_varying_name,1,0x8c8c,
                      false,(GLint *)0x0);
  this->m_program_id_with_geometry_shader = GVar12;
  pTVar15 = deqp::Context::getTestContext(this->m_context);
  pTVar16 = tcu::TestContext::getLog(pTVar15);
  GVar12 = Utilities::buildProgram
                     (gl_00,pTVar16,(GLchar *)0x0,m_tessellation_control_shader,
                      m_tessellation_evaluation_shader,s_vertex_shader_without_output,
                      s_fragment_shader,&m_varying_name,1,0x8c8c,false,(GLint *)0x0);
  this->m_program_id_with_tessellation_shaders = GVar12;
  local_11d = false;
  if ((((this->m_program_id_with_input_output != 0) &&
       (local_11d = false, this->m_program_id_with_output != 0)) &&
      (local_11d = false, this->m_program_id_without_output != 0)) &&
     (local_11d = false, this->m_program_id_with_geometry_shader != 0)) {
    local_11d = this->m_program_id_with_tessellation_shaders != 0;
  }
  local_41 = local_11d;
  if ((bVar1) || (bVar4)) {
    local_11e = false;
    if (local_11d != false) {
      local_11e = testExtension1(this);
    }
    local_41 = local_11e;
  }
  if ((bVar2) || (bVar5)) {
    local_120 = false;
    if (local_41 != false) {
      local_120 = testExtension2(this);
    }
    local_41 = local_120;
  }
  if ((bVar2) || (bVar6)) {
    local_122 = false;
    if (local_41 != false) {
      local_122 = testExtension3(this);
    }
    local_41 = local_122;
  }
  if ((bVar3) || (bVar7)) {
    local_124 = false;
    if (local_41 != false) {
      local_124 = testInstanced(this);
    }
    local_41 = local_124;
  }
  if (this->m_vertex_array_object != 0) {
    (*gl_00->deleteVertexArrays)(1,&this->m_vertex_array_object);
    this->m_vertex_array_object = 0;
  }
  if (this->m_buffer_0 != 0) {
    (*gl_00->deleteBuffers)(1,&this->m_buffer_0);
    this->m_buffer_0 = 0;
  }
  if (this->m_buffer_1 != 0) {
    (*gl_00->deleteBuffers)(1,&this->m_buffer_1);
    this->m_buffer_1 = 0;
  }
  if (this->m_transform_feedback_object_0 != 0) {
    (*gl_00->deleteTransformFeedbacks)(1,&this->m_transform_feedback_object_0);
    this->m_transform_feedback_object_0 = 0;
  }
  if (this->m_transform_feedback_object_1 != 0) {
    (*gl_00->deleteTransformFeedbacks)(1,&this->m_transform_feedback_object_1);
    this->m_transform_feedback_object_1 = 0;
  }
  if (this->m_query_object != 0) {
    (*gl_00->deleteQueries)(1,&this->m_query_object);
    this->m_query_object = 0;
  }
  if (this->m_program_id_with_input_output != 0) {
    (*gl_00->deleteProgram)(this->m_program_id_with_input_output);
    this->m_program_id_with_input_output = 0;
  }
  if (this->m_program_id_with_output != 0) {
    (*gl_00->deleteProgram)(this->m_program_id_with_output);
    this->m_program_id_with_output = 0;
  }
  if (this->m_program_id_without_output != 0) {
    (*gl_00->deleteProgram)(this->m_program_id_without_output);
    this->m_program_id_without_output = 0;
  }
  if (this->m_program_id_with_geometry_shader != 0) {
    (*gl_00->deleteProgram)(this->m_program_id_with_geometry_shader);
    this->m_program_id_with_geometry_shader = 0;
  }
  if (this->m_program_id_with_tessellation_shaders != 0) {
    (*gl_00->deleteProgram)(this->m_program_id_with_tessellation_shaders);
    this->m_program_id_with_tessellation_shaders = 0;
  }
  if (local_41 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::APIErrors::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_at_least_gl_40 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_at_least_gl_42 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 2)));

	bool is_ext_tf_1		 = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");
	bool is_arb_tf_2		 = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback2");
	bool is_arb_tf_3		 = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3");
	bool is_arb_tf_instanced = m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback_instanced");

	if (is_ext_tf_1)
	{
		/* Extension query. */
		m_glBindBufferOffsetEXT =
			(BindBufferOffsetEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glBindBufferOffsetEXT");
		m_glGetIntegerIndexedvEXT =
			(GetIntegerIndexedvEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glGetIntegerIndexedvEXT");
		m_glGetBooleanIndexedvEXT =
			(GetBooleanIndexedvEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glGetBooleanIndexedvEXT");
	}

	if (is_at_least_gl_40 || is_arb_tf_2)
	{
		/* Create transform feedback objects. */
		gl.genTransformFeedbacks(1, &m_transform_feedback_object_0);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");
	}

	if (is_at_least_gl_40 || is_arb_tf_3)
	{
		/* Create query object. */
		gl.genQueries(1, &m_query_object);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenQueries call failed.");
	}

	if (is_at_least_gl_42 || is_arb_tf_instanced)
	{
		/* Create transform feedback objects. */
		gl.genTransformFeedbacks(1, &m_transform_feedback_object_1);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTransformFeedbacks call failed.");
	}

	/* Default result. */
	bool is_ok		= true;
	bool test_error = false;

	/* Entities setup. */
	try
	{
		/* VAO setup. */
		gl.genVertexArrays(1, &m_vertex_array_object);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

		gl.bindVertexArray(m_vertex_array_object);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

		/* Buffer setup. */
		gl.genBuffers(1, &m_buffer_0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer_0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		gl.genBuffers(1, &m_buffer_1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

		gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

		gl.bufferData(GL_ARRAY_BUFFER, m_buffer_1_size, m_buffer_1_data, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

		/* Programs setup. */

		m_program_id_with_input_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_with_input_output,
			s_fragment_shader, &m_varying_name, 1, GL_INTERLEAVED_ATTRIBS);

		m_program_id_with_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_with_output, s_fragment_shader,
			&m_varying_name, 1, GL_INTERLEAVED_ATTRIBS, true);

		m_program_id_without_output = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, s_vertex_shader_without_output,
			s_fragment_shader, NULL, 0, GL_SEPARATE_ATTRIBS);

		m_program_id_with_geometry_shader = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), m_geometry_shader, NULL, NULL, s_vertex_shader_without_output,
			s_fragment_shader, &m_varying_name, 1, GL_INTERLEAVED_ATTRIBS);

		m_program_id_with_tessellation_shaders = gl3cts::TransformFeedback::Utilities::buildProgram(
			gl, m_context.getTestContext().getLog(), NULL, m_tessellation_control_shader,
			m_tessellation_evaluation_shader, s_vertex_shader_without_output, s_fragment_shader, &m_varying_name, 1,
			GL_INTERLEAVED_ATTRIBS);

		is_ok = is_ok && m_program_id_with_input_output && m_program_id_with_output && m_program_id_without_output &&
				m_program_id_with_geometry_shader && m_program_id_with_tessellation_shaders;
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Iterating tests. */
	try
	{
		if (is_at_least_gl_30 || is_ext_tf_1)
		{
			is_ok = is_ok && testExtension1();
		}

		if (is_at_least_gl_40 || is_arb_tf_2)
		{
			is_ok = is_ok && testExtension2();
		}

		if (is_at_least_gl_40 || is_arb_tf_3)
		{
			is_ok = is_ok && testExtension3();
		}

		if (is_at_least_gl_42 || is_arb_tf_instanced)
		{
			is_ok = is_ok && testInstanced();
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Deinitialization. */
	if (m_vertex_array_object)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object);

		m_vertex_array_object = 0;
	}

	if (m_buffer_0)
	{
		gl.deleteBuffers(1, &m_buffer_0); // silently unbinds

		m_buffer_0 = 0;
	}

	if (m_buffer_1)
	{
		gl.deleteBuffers(1, &m_buffer_1); // silently unbinds

		m_buffer_1 = 0;
	}

	if (m_transform_feedback_object_0)
	{
		gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_0);

		m_transform_feedback_object_0 = 0;
	}

	if (m_transform_feedback_object_1)
	{
		gl.deleteTransformFeedbacks(1, &m_transform_feedback_object_1);

		m_transform_feedback_object_1 = 0;
	}

	if (m_query_object)
	{
		gl.deleteQueries(1, &m_query_object);

		m_query_object = 0;
	}

	if (m_program_id_with_input_output)
	{
		gl.deleteProgram(m_program_id_with_input_output);

		m_program_id_with_input_output = 0;
	}

	if (m_program_id_with_output)
	{
		gl.deleteProgram(m_program_id_with_output);

		m_program_id_with_output = 0;
	}

	if (m_program_id_without_output)
	{
		gl.deleteProgram(m_program_id_without_output);

		m_program_id_without_output = 0;
	}

	if (m_program_id_with_geometry_shader)
	{
		gl.deleteProgram(m_program_id_with_geometry_shader);

		m_program_id_with_geometry_shader = 0;
	}

	if (m_program_id_with_tessellation_shaders)
	{
		gl.deleteProgram(m_program_id_with_tessellation_shaders);

		m_program_id_with_tessellation_shaders = 0;
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}